

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O3

RC __thiscall RM_FileHandle::SetBit(RM_FileHandle *this,char *bitmap,int size,int bitnum)

{
  int iVar1;
  RC RVar2;
  
  RVar2 = 0x68;
  if (bitnum <= size) {
    iVar1 = bitnum + 7;
    if (-1 < bitnum) {
      iVar1 = bitnum;
    }
    bitmap[iVar1 >> 3] =
         bitmap[iVar1 >> 3] | (byte)(1 << ((char)bitnum - ((byte)iVar1 & 0xf8) & 0x1f));
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

RC RM_FileHandle::SetBit(char *bitmap, int size, int bitnum){
  if (bitnum > size)
    return (RM_INVALIDBITOPERATION);
  int chunk = bitnum /8;
  int offset = bitnum - chunk*8;
  bitmap[chunk] |= 1 << offset;
  return (0);
}